

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

void init_estimate_block_intra_args(estimate_block_intra_args *args,AV1_COMP *cpi,MACROBLOCK *x)

{
  MACROBLOCK *x_local;
  AV1_COMP *cpi_local;
  estimate_block_intra_args *args_local;
  
  args->cpi = cpi;
  args->x = x;
  args->mode = '\0';
  args->skippable = 1;
  args->rdc = (RD_STATS *)0x0;
  args->best_sad = 0xffffffff;
  args->prune_mode_based_on_sad = false;
  args->prune_palette_sad = false;
  return;
}

Assistant:

static inline void init_estimate_block_intra_args(
    struct estimate_block_intra_args *args, AV1_COMP *cpi, MACROBLOCK *x) {
  args->cpi = cpi;
  args->x = x;
  args->mode = DC_PRED;
  args->skippable = 1;
  args->rdc = 0;
  args->best_sad = UINT_MAX;
  args->prune_mode_based_on_sad = false;
  args->prune_palette_sad = false;
}